

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Bool prvTidyTidyMetaCharset(TidyDocImpl *doc)

{
  Node *pNVar1;
  TidyAllocator *pTVar2;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ctmbstr str;
  Node *element;
  AttVal *pAVar10;
  AttVal *pAVar11;
  tmbstr ptVar12;
  Node *pNVar13;
  Bool BVar14;
  Bool BVar15;
  TidyBuffer charsetString;
  TidyBuffer buf;
  TidyBuffer local_70;
  TidyBuffer local_50;
  
  uVar7 = *(uint *)((doc->config).value + 0x3c);
  str = prvTidyGetEncodingNameFromTidyId(uVar7);
  element = prvTidyFindHEAD(doc);
  BVar14 = no;
  BVar15 = no;
  if (str != (ctmbstr)0x0 && element != (Node *)0x0) {
    iVar9 = *(int *)((doc->config).value + 0x35);
    uVar6 = prvTidytmbstrlen(str);
    BVar15 = BVar14;
    if ((((uVar6 != 0) && (uVar7 != 0)) && (uVar7 != 5)) && (*(int *)((doc->config).value + 6) != 1)
       ) {
      tidyBufInit(&local_70);
      tidyBufClear(&local_70);
      tidyBufAppend(&local_70,"charset=",8);
      uVar7 = prvTidytmbstrlen(str);
      tidyBufAppend(&local_70,str,uVar7);
      tidyBufAppend(&local_70,"",1);
      pNVar13 = element->content;
      bVar4 = false;
      if (pNVar13 != (Node *)0x0) {
        bVar4 = false;
        do {
          if ((pNVar13->tag != (Dict *)0x0) && (pNVar13->tag->id == TidyTag_META)) {
            pAVar10 = prvTidyAttrGetById(pNVar13,TidyAttr_CHARSET);
            pAVar11 = prvTidyAttrGetById(pNVar13,TidyAttr_HTTP_EQUIV);
            if (pAVar10 != (AttVal *)0x0 || pAVar11 != (AttVal *)0x0) {
              if (pAVar10 == (AttVal *)0x0 || pAVar11 != (AttVal *)0x0) {
                if (pAVar11 == (AttVal *)0x0 || pAVar10 != (AttVal *)0x0) {
                  if (pAVar10 != (AttVal *)0x0 && pAVar11 != (AttVal *)0x0) goto LAB_0014cb23;
                }
                else {
                  pAVar10 = prvTidyAttrGetById(pNVar13,TidyAttr_CONTENT);
                  if (pAVar10 != (AttVal *)0x0) {
                    if (pAVar11->value == (ctmbstr)0x0) goto LAB_0014cb23;
                    iVar8 = prvTidytmbstrcasecmp(pAVar11->value,"content-type");
                    if ((iVar8 == 0) && (pAVar10->value != (ctmbstr)0x0)) {
                      iVar8 = prvTidytmbstrcasecmp(pAVar10->value,(ctmbstr)local_70.bp);
                      if (iVar8 == 0) {
                        bVar5 = !bVar4;
                        bVar4 = true;
                        if (bVar5) goto LAB_0014ccf1;
                      }
                      else {
                        bVar5 = !bVar4;
                        bVar4 = true;
                        if (bVar5) {
                          pTVar2 = doc->allocator;
                          p_Var3 = pTVar2->vtbl->alloc;
                          uVar7 = prvTidytmbstrlen(str);
                          ptVar12 = (tmbstr)(*p_Var3)(pTVar2,(long)uVar7 + 0x14);
                          prvTidytmbstrcpy(ptVar12,"text/html; charset=");
                          prvTidytmbstrcpy(ptVar12 + 0x13,str);
                          if (*(int *)((doc->config).value + 0x4d) != 0) {
                            prvTidyReportAttrError(doc,pNVar13,pAVar10,0x228);
                          }
                          (*doc->allocator->vtbl->free)(doc->allocator,pAVar10->value);
                          pAVar10->value = ptVar12;
LAB_0014ccf1:
                          bVar4 = true;
                          goto LAB_0014cb54;
                        }
                      }
LAB_0014cb23:
                      pNVar1 = pNVar13->prev;
                      prvTidyReport(doc,element,pNVar13,0x235);
                      prvTidyDiscardElement(doc,pNVar13);
                      pNVar13 = pNVar1;
                      if (pNVar1 == (Node *)0x0) break;
                    }
                  }
                }
              }
              else {
                if ((bVar4) || (pAVar10->value == (ctmbstr)0x0)) goto LAB_0014cb23;
                iVar8 = prvTidytmbstrcasecmp(pAVar10->value,str);
                if (iVar8 != 0) {
                  pTVar2 = doc->allocator;
                  p_Var3 = pTVar2->vtbl->alloc;
                  uVar7 = prvTidytmbstrlen(str);
                  ptVar12 = (tmbstr)(*p_Var3)(pTVar2,(long)uVar7 + 1);
                  prvTidytmbstrcpy(ptVar12,str);
                  prvTidyReportAttrError(doc,pNVar13,pAVar10,0x228);
                  (*doc->allocator->vtbl->free)(doc->allocator,pAVar10->value);
                  pAVar10->value = ptVar12;
                }
                bVar4 = true;
                if (pNVar13 != element->content->next) {
                  prvTidyRemoveNode(pNVar13);
                  prvTidyInsertNodeAtStart(element,pNVar13);
                }
              }
            }
          }
LAB_0014cb54:
          pNVar13 = pNVar13->next;
        } while (pNVar13 != (Node *)0x0);
      }
      if ((iVar9 != 0) && (!bVar4)) {
        pNVar13 = prvTidyInferredTag(doc,TidyTag_META);
        iVar9 = prvTidyHTMLVersion(doc);
        if ((iVar9 == 0x40000) || (iVar9 == 0x20000)) {
          prvTidyAddAttribute(doc,pNVar13,"charset",str);
        }
        else {
          tidyBufInit(&local_50);
          tidyBufAppend(&local_50,"text/html; ",0xb);
          uVar7 = prvTidytmbstrlen((ctmbstr)local_70.bp);
          tidyBufAppend(&local_50,local_70.bp,uVar7);
          tidyBufAppend(&local_50,"",1);
          prvTidyAddAttribute(doc,pNVar13,"http-equiv","Content-Type");
          prvTidyAddAttribute(doc,pNVar13,"content",(ctmbstr)local_50.bp);
          tidyBufFree(&local_50);
        }
        prvTidyInsertNodeAtStart(element,pNVar13);
        prvTidyReport(doc,pNVar13,element,0x222);
      }
      tidyBufFree(&local_70);
      BVar15 = yes;
    }
  }
  return BVar15;
}

Assistant:

Bool TY_(TidyMetaCharset)(TidyDocImpl* doc)
{
    AttVal *charsetAttr;
    AttVal *contentAttr;
    AttVal *httpEquivAttr;
    Bool charsetFound = no;
    uint outenc = cfg(doc, TidyOutCharEncoding);
    ctmbstr enc = TY_(GetEncodingNameFromTidyId)(outenc);
    Node *currentNode;
    Node *head = TY_(FindHEAD)(doc);
    Node *metaTag;
    Node *prevNode;
    TidyBuffer buf;
    TidyBuffer charsetString;
    /* tmbstr httpEquivAttrValue; */
    /* tmbstr lcontent; */
    tmbstr newValue;
    Bool add_meta = cfgBool(doc, TidyMetaCharset);

    /* We can't do anything we don't have a head or encoding is NULL */
    if (!head || !enc || !TY_(tmbstrlen)(enc))
        return no;
    if (outenc == RAW)
        return no;
#ifndef NO_NATIVE_ISO2022_SUPPORT
    if (outenc == ISO2022)
        return no;
#endif
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return no; /* nothing to do here if showing body only */

    tidyBufInit(&charsetString);
    /* Set up the content test 'charset=value' */
    tidyBufClear(&charsetString);
    tidyBufAppend(&charsetString, "charset=", 8);
    tidyBufAppend(&charsetString, (char*)enc, TY_(tmbstrlen)(enc));
    tidyBufAppend(&charsetString, "\0", 1); /* zero terminate the buffer */
    /* process the children of the head */
    /* Issue #656 - guard against 'currentNode' being set NULL in loop */
    for (currentNode = head->content; currentNode; 
        currentNode = (currentNode ? currentNode->next : NULL))
    {
        if (!nodeIsMETA(currentNode))
            continue;   /* not a meta node */
        charsetAttr = attrGetCHARSET(currentNode);
        httpEquivAttr = attrGetHTTP_EQUIV(currentNode);
        if (!charsetAttr && !httpEquivAttr)
            continue;   /* has no charset attribute */
                        /*
                        Meta charset comes in quite a few flavors:
                        1. <meta charset="value"> - expected for (X)HTML5.
                        */
        if (charsetAttr && !httpEquivAttr)
        {
            /* we already found one, so remove the rest. */
            if (charsetFound || !charsetAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            charsetFound = yes;
            /* Fix mismatched attribute value */
            if (TY_(tmbstrcasecmp)(charsetAttr->value, enc) != 0)
            {
                newValue = (tmbstr)TidyDocAlloc(doc, TY_(tmbstrlen)(enc) + 1);   /* allocate + 1 for 0 */
                TY_(tmbstrcpy)(newValue, enc);
                /* Note: previously http-equiv had been modified, without warning
                in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
                */
                TY_(ReportAttrError)(doc, currentNode, charsetAttr, ATTRIBUTE_VALUE_REPLACED);
                TidyDocFree(doc, charsetAttr->value);   /* free current value */
                charsetAttr->value = newValue;
            }
            /* Make sure it's the first element. */
            if (currentNode != head->content->next) {
                TY_(RemoveNode)(currentNode);
                TY_(InsertNodeAtStart)(head, currentNode);
            }
            continue;
        }
        /*
        2. <meta http-equiv="content-type" content="text/html; charset=UTF-8">
        expected for HTML4. This is normally ok - but can clash.
        */
        if (httpEquivAttr && !charsetAttr)
        {
            contentAttr = TY_(AttrGetById)(currentNode, TidyAttr_CONTENT);
            if (!contentAttr)
                continue;   /* has no 'content' attribute */
            if (!httpEquivAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            /* httpEquivAttrValue = TY_(tmbstrtolower)(httpEquivAttr->value); */
            if (TY_(tmbstrcasecmp)(httpEquivAttr->value, (tmbstr) "content-type") != 0)
                continue;   /* is not 'content-type' */
            if (!contentAttr->value)
            {
                continue; /* has no 'content' attribute has NO VALUE! */
            }
            /* check encoding matches
            If a miss-match found here, fix it. previous silently done
            in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
            lcontent = TY_(tmbstrtolower)(contentAttr->value);
            */
            if (TY_(tmbstrcasecmp)(contentAttr->value, (ctmbstr)charsetString.bp) == 0)
            {
                /* we already found one, so remove the rest. */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                    continue;
                }
                charsetFound = yes;
            }
            else
            {
                /* fix a mismatch */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                }
                else
                {
                    /* correct the content */
                    newValue = (tmbstr)TidyDocAlloc(doc, 19 + TY_(tmbstrlen)(enc) + 1);
                    TY_(tmbstrcpy)(newValue, "text/html; charset=");
                    TY_(tmbstrcpy)(newValue + 19, enc);
                    if (cfgBool(doc, TidyShowMetaChange))   /* Issue #456 - backward compatibility only */
                        TY_(ReportAttrError)(doc, currentNode, contentAttr, ATTRIBUTE_VALUE_REPLACED);
                    TidyDocFree(doc, contentAttr->value);
                    contentAttr->value = newValue;
                    charsetFound = yes;
                }
            }
            continue;
        }
        /*
        3. <meta charset="utf-8" http-equiv="Content-Type" content="...">
        This is generally bad. Discard and warn.
        */
        if (httpEquivAttr && charsetAttr)
        {
            /* printf("WARN ABOUT HTTP EQUIV AND CHARSET ATTR! \n"); */
            prevNode = currentNode->prev;
            TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
            TY_(DiscardElement)(doc, currentNode);
            currentNode = prevNode;
        }
    }

    /* completed head scan - add appropriate meta - if 'yes' and none exists */
    if (add_meta && !charsetFound)
    {
        /* add appropriate meta charset tag - no warning */
        metaTag = TY_(InferredTag)(doc, TidyTag_META);
        switch (TY_(HTMLVersion)(doc))
        {
        case HT50:
        case XH50:
            TY_(AddAttribute)(doc, metaTag, "charset", enc);
            break;
        default:
            tidyBufInit(&buf);
            tidyBufAppend(&buf, "text/html; ", 11);
            tidyBufAppend(&buf, charsetString.bp, TY_(tmbstrlen)((ctmbstr)charsetString.bp));
            tidyBufAppend(&buf, "\0", 1);   /* zero terminate the buffer */
            TY_(AddAttribute)(doc, metaTag, "http-equiv", "Content-Type"); /* add 'http-equiv' const. */
            TY_(AddAttribute)(doc, metaTag, "content", (char*)buf.bp);  /* add 'content="<enc>"' */
            tidyBufFree(&buf);
        }
        TY_(InsertNodeAtStart)(head, metaTag);
        TY_(Report)(doc, metaTag, head, ADDED_MISSING_CHARSET); /* actually just 'Info:' */
    }
    tidyBufFree(&charsetString);
    return yes;
}